

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O0

qint64 QJsonValueConstRef::concreteInt(QJsonValueConstRef self,qint64 defaultValue,bool clamp)

{
  QJsonValueConstRef r;
  enable_if_t<std::is_integral_v<long_long>,_bool> eVar1;
  anon_union_8_3_4e90986c_for_QJsonValueConstRef_0 *paVar2;
  byte in_CL;
  anon_union_8_3_4e90986c_for_QJsonValueConstRef_0 in_RDX;
  long in_FS_OFFSET;
  double v_00;
  Element *e;
  qint64 v;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined8 in_stack_ffffffffffffffc8;
  anon_union_8_3_4e90986c_for_QJsonValueConstRef_0 aVar3;
  anon_union_8_3_4e90986c_for_QJsonValueConstRef_0 local_30 [5];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  r._8_8_ = in_stack_ffffffffffffffc8;
  r.field_0.a = in_RDX.a;
  paVar2 = (anon_union_8_3_4e90986c_for_QJsonValueConstRef_0 *)QJsonPrivate::Value::elementHelper(r)
  ;
  local_30[0] = in_RDX;
  if (*(int *)(paVar2 + 1) == 0x202) {
    v_00 = QtCbor::Element::fpvalue
                     ((Element *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    eVar1 = anon_unknown.dwarf_995023::convertDoubleTo<long_long>(v_00,(longlong *)local_30,true);
    if (!eVar1) {
      local_30[0] = in_RDX;
    }
  }
  else if (*(int *)(paVar2 + 1) == 0) {
    local_30[0] = (anon_union_8_3_4e90986c_for_QJsonValueConstRef_0)paVar2->a;
  }
  aVar3 = local_30[0];
  if (((in_CL & 1) != 0) && ((QJsonArray *)(long)local_30[0]._0_4_ != local_30[0].a)) {
    aVar3 = in_RDX;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (qint64)aVar3.d;
}

Assistant:

qint64 QJsonValueConstRef::concreteInt(QJsonValueConstRef self, qint64 defaultValue, bool clamp) noexcept
{
    auto &e = QJsonPrivate::Value::elementHelper(self);
    qint64 v = defaultValue;
    if (e.type == QCborValue::Double) {
        // convertDoubleTo modifies the output even on returning false
        if (!convertDoubleTo<qint64>(e.fpvalue(), &v))
            v = defaultValue;
    } else if (e.type == QCborValue::Integer) {
        v = e.value;
    }
    if (clamp && qint64(int(v)) != v)
        return defaultValue;
    return v;
}